

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ring_gen_keys.c
# Opt level: O1

int main(void)

{
  ulong *puVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  ulp_ring_private_key *priv_key;
  ulp_ring_public_key *pub_key;
  ulp_ring_private_key *local_28;
  ulp_ring_public_key *local_20;
  
  local_20 = (ulp_ring_public_key *)0x0;
  local_28 = (ulp_ring_private_key *)0x0;
  iVar3 = ulp_ring_generate_key_pair(0x100,0x1da7e,0x1fe2f37,0x3f8c027d93dd95,&local_20,&local_28);
  if ((((local_20 != (ulp_ring_public_key *)0x0 && iVar3 == 0) && (local_20->n == 0x100)) &&
      (local_20->q == 0x3f8c027d93dd95)) &&
     ((local_20->se == 0x1fe2f37 && (puVar1 = local_20->a, puVar1 != (ulong *)0x0)))) {
    if ((((local_28 != (ulp_ring_private_key *)0x0 && local_20->p != (uint64_t *)0x0) &&
         ((local_28->n == 0x100 && (local_28->q == 0x3f8c027d93dd95)))) &&
        (local_28->s != (uint64_t *)0x0)) && (*puVar1 < 0x3f8c027d93dd95)) {
      bVar5 = false;
      uVar4 = 0;
      do {
        if ((0x3f8c027d93dd94 < local_20->p[uVar4]) || (0x1da7d < local_28->s[uVar4])) break;
        bVar5 = 0xfe < uVar4;
        if (uVar4 == 0xff) goto LAB_0010127f;
        lVar2 = uVar4 + 1;
        uVar4 = uVar4 + 1;
      } while (puVar1[lVar2] < 0x3f8c027d93dd95);
      if (bVar5) {
LAB_0010127f:
        ulp_ring_free_public_key(local_20);
        iVar3 = 0;
        goto LAB_00101292;
      }
    }
  }
  ulp_ring_free_public_key(local_20);
  iVar3 = 1;
LAB_00101292:
  ulp_ring_free_private_key(local_28);
  return iVar3;
}

Assistant:

int main() {

    ulp_ring_public_key* pub_key = NULL;
    ulp_ring_private_key* priv_key = NULL;

    size_t n = 256;
    uint64_t sk = 121470;
    uint64_t se = 33435447;
    uint64_t q = 17886865857437077;

    // generate key pair and do sanity checks

    if(ulp_ring_generate_key_pair(n, sk, se, q, &pub_key, &priv_key) != 0)
        goto error;

    if(pub_key == NULL || pub_key->n != n || pub_key->q != q || pub_key->se != se || pub_key->a == NULL || pub_key->p == NULL)
        goto error;

    if(priv_key == NULL || priv_key->n != n || priv_key->q != q || priv_key->s == NULL)
        goto error;

    // check if values are below thresholds

    for(size_t i = 0; i < n; i++) {
        if(pub_key->a[i] >= q || pub_key->p[i] >= q || priv_key->s[i] >= sk)
            goto error;
    }

    ulp_ring_free_public_key(pub_key);
    ulp_ring_free_private_key(priv_key);
    return 0;


    error:
        ulp_ring_free_public_key(pub_key);
        ulp_ring_free_private_key(priv_key);
        return 1;

}